

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O0

void __thiscall
xLearn::PARSER_TEST_Parse_libffm_comma_Test::~PARSER_TEST_Parse_libffm_comma_Test
          (PARSER_TEST_Parse_libffm_comma_Test *this)

{
  void *in_RDI;
  
  ~PARSER_TEST_Parse_libffm_comma_Test((PARSER_TEST_Parse_libffm_comma_Test *)0x14dc28);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(PARSER_TEST, Parse_libffm_comma) {
  write_data(Kfilename, kStrFFM_comma);
  char* buffer = nullptr;
  uint64 size = ReadFileToMemory(Kfilename, &buffer);
  DMatrix matrix;
  FFMParser parser;
  parser.setLabel(true);
  parser.setSplitor(",");
  parser.Parse(buffer, size, matrix, true);
  check(matrix, true, true);
  parser.Parse(buffer, size, matrix, false);
  check_double(matrix, true, true);
  parser.Parse(buffer, size, matrix, true);
  check(matrix, true, true);
  RemoveFile(Kfilename.c_str());
}